

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecvt.cpp
# Opt level: O1

uint32_t __thiscall
booster::locale::impl_posix::mb2_iconv_converter::to_unicode
          (mb2_iconv_converter *this,char **begin,char *end)

{
  byte bVar1;
  byte *pbVar2;
  uint32_t uVar3;
  iconv_t pvVar4;
  uint32_t result [2];
  char inseq [3];
  size_t insize;
  char *outbuf;
  size_t outsize;
  char *inbuf;
  uint32_t local_48 [3];
  byte local_3b;
  char local_3a;
  undefined1 local_39;
  size_t local_38;
  char *local_30;
  size_t local_28;
  byte *local_20;
  
  pbVar2 = (byte *)*begin;
  uVar3 = 0xfffffffe;
  if (pbVar2 != (byte *)end) {
    bVar1 = *pbVar2;
    uVar3 = (((this->first_byte_table_).
              super___shared_ptr<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[bVar1];
    if (uVar3 == 0xfffffffe) {
      uVar3 = 0xfffffffe;
      if (pbVar2 + 1 != (byte *)end) {
        if (this->to_utf_ == (iconv_t)0xffffffffffffffff) {
          pvVar4 = iconv_open("UTF-32LE",(this->encoding_)._M_dataplus._M_p);
          this->to_utf_ = pvVar4;
        }
        local_20 = &local_3b;
        local_3a = (*begin)[1];
        local_39 = 0;
        local_38 = 3;
        local_48[0] = 0xffffffff;
        local_48[1] = 0xffffffff;
        local_28 = 8;
        local_3b = bVar1;
        local_30 = (char *)local_48;
        iconv(this->to_utf_,(char **)&local_20,&local_38,&local_30,&local_28);
        uVar3 = 0xffffffff;
        if (((local_28 == 0) && (local_38 == 0)) && (local_48[1] == 0)) {
          *begin = *begin + 2;
          uVar3 = local_48[0];
        }
      }
    }
    else if (uVar3 != 0xffffffff) {
      *begin = (char *)(pbVar2 + 1);
    }
  }
  return uVar3;
}

Assistant:

uint32_t to_unicode(char const *&begin,char const *end)
        {
            if(begin == end)
                return incomplete;
            
            unsigned char seq0 = *begin;
            uint32_t index = (*first_byte_table_)[seq0];
            if(index == illegal)
                return illegal;
            if(index != incomplete) {
                begin++;
                return index;
            }
            else if(begin+1 == end)
                return incomplete;
            
            open(to_utf_,utf32_encoding(),encoding_.c_str());

            // maybe illegal or may be double byte

            char inseq[3] = { static_cast<char>(seq0) , begin[1], 0};
            char *inbuf = inseq;
            size_t insize = 3;
            uint32_t result[2] = { illegal, illegal };
            size_t outsize = 8;
            char *outbuf = reinterpret_cast<char*>(result);
            call_iconv(to_utf_,&inbuf,&insize,&outbuf,&outsize);
            if(outsize == 0 && insize == 0 && result[1]==0 ) {
                begin+=2;
                return result[0];
            }
            return illegal;
        }